

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.hpp
# Opt level: O0

double ear::hoa::norm_N3D(int n,int abs_m)

{
  double dVar1;
  double dVar2;
  int abs_m_local;
  int n_local;
  
  dVar1 = boost::math::factorial<double>(n - abs_m);
  dVar2 = boost::math::factorial<double>(n + abs_m);
  dVar1 = sqrt((((double)n + (double)n + 1.0) * dVar1) / dVar2);
  return dVar1;
}

Assistant:

inline double norm_N3D(int n, int abs_m) {
      return std::sqrt((2.0 * n + 1.0) *
                       boost::math::factorial<double>(n - abs_m) /
                       boost::math::factorial<double>(n + abs_m));
    }